

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

message_order * __thiscall
FIX::DataDictionary::getMessageOrderedFields(DataDictionary *this,string *msgType)

{
  bool bVar1;
  ConfigError *this_00;
  pointer ppVar2;
  message_order *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Self local_28;
  _Self local_20;
  const_iterator iter;
  string *msgType_local;
  DataDictionary *this_local;
  
  iter._M_node = (_Base_ptr)msgType;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>_>_>
       ::find(&this->m_messageOrderedFields,msgType);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>_>_>
       ::end(&this->m_messageOrderedFields);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>_>
             ::operator->(&local_20);
    pmVar3 = MessageFieldsOrderHolder::getMessageOrder(&ppVar2->second);
    return pmVar3;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_68,"<Message> ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iter._M_node);
  std::operator+(&local_48,&local_68," does not have a stored message order");
  ConfigError::ConfigError(this_00,&local_48);
  __cxa_throw(this_00,&ConfigError::typeinfo,ConfigError::~ConfigError);
}

Assistant:

EXCEPT(ConfigError) {
  MsgTypeToOrderedFields::const_iterator iter = m_messageOrderedFields.find(msgType);
  if (iter == m_messageOrderedFields.end()) {
    throw ConfigError("<Message> " + msgType + " does not have a stored message order");
  }

  return iter->second.getMessageOrder();
}